

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBvhTriangleMeshShape.cpp
# Opt level: O2

void __thiscall
btBvhTriangleMeshShape::performConvexcast::MyNodeOverlapCallback::processNode
          (MyNodeOverlapCallback *this,int nodeSubPart,int nodeTriangleIndex)

{
  float fVar1;
  btStridingMeshInterface *pbVar2;
  ulong uVar3;
  int j;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  float fVar9;
  PHY_ScalarType indicestype;
  ulong local_98;
  uchar *vertexbase;
  int numfaces;
  int indexstride;
  int stride;
  PHY_ScalarType type;
  int numverts;
  uchar *indexbase;
  btVector3 m_triangle [3];
  
  local_98 = (ulong)(uint)nodeSubPart;
  (*this->m_meshInterface->_vptr_btStridingMeshInterface[4])
            (this->m_meshInterface,&vertexbase,&numverts,&type,&stride,&indexbase,&indexstride,
             &numfaces,&indicestype,local_98);
  uVar3 = local_98;
  pbVar2 = this->m_meshInterface;
  for (uVar4 = 2; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
    uVar5 = (ulong)uVar4;
    if (indicestype == PHY_SHORT) {
      uVar6 = (uint)*(ushort *)(indexbase + uVar5 * 2 + (long)nodeTriangleIndex * (long)indexstride)
      ;
    }
    else {
      uVar6 = *(uint *)(indexbase + uVar5 * 4 + (long)nodeTriangleIndex * (long)indexstride);
    }
    lVar7 = (long)(int)uVar6 * (long)stride;
    if (type == PHY_FLOAT) {
      uVar8 = *(undefined8 *)(pbVar2->m_scaling).m_floats;
      uVar8 = CONCAT44((float)((ulong)uVar8 >> 0x20) *
                       (float)((ulong)*(undefined8 *)(vertexbase + lVar7) >> 0x20),
                       (float)uVar8 * (float)*(undefined8 *)(vertexbase + lVar7));
      fVar9 = *(float *)(vertexbase + lVar7 + 8);
    }
    else {
      fVar9 = (float)*(double *)(vertexbase + lVar7 + 0x10);
      uVar8 = *(undefined8 *)(pbVar2->m_scaling).m_floats;
      uVar8 = CONCAT44((float)((ulong)uVar8 >> 0x20) *
                       (float)*(double *)((long)(vertexbase + lVar7) + 8),
                       (float)uVar8 * (float)*(double *)(vertexbase + lVar7));
    }
    fVar1 = (pbVar2->m_scaling).m_floats[2];
    *(undefined8 *)m_triangle[uVar5].m_floats = uVar8;
    m_triangle[uVar5].m_floats[2] = fVar9 * fVar1;
    m_triangle[uVar5].m_floats[3] = 0.0;
  }
  (*this->m_callback->_vptr_btTriangleCallback[2])
            (this->m_callback,m_triangle,local_98 & 0xffffffff,(ulong)(uint)nodeTriangleIndex);
  (*this->m_meshInterface->_vptr_btStridingMeshInterface[6])
            (this->m_meshInterface,uVar3 & 0xffffffff);
  return;
}

Assistant:

virtual void processNode(int nodeSubPart, int nodeTriangleIndex)
		{
			btVector3 m_triangle[3];
			const unsigned char *vertexbase;
			int numverts;
			PHY_ScalarType type;
			int stride;
			const unsigned char *indexbase;
			int indexstride;
			int numfaces;
			PHY_ScalarType indicestype;

			m_meshInterface->getLockedReadOnlyVertexIndexBase(
				&vertexbase,
				numverts,
				type,
				stride,
				&indexbase,
				indexstride,
				numfaces,
				indicestype,
				nodeSubPart);

			unsigned int* gfxbase = (unsigned int*)(indexbase+nodeTriangleIndex*indexstride);
			btAssert(indicestype==PHY_INTEGER||indicestype==PHY_SHORT);
	
			const btVector3& meshScaling = m_meshInterface->getScaling();
			for (int j=2;j>=0;j--)
			{
				int graphicsindex = indicestype==PHY_SHORT?((unsigned short*)gfxbase)[j]:gfxbase[j];

				if (type == PHY_FLOAT)
				{
					float* graphicsbase = (float*)(vertexbase+graphicsindex*stride);

					m_triangle[j] = btVector3(graphicsbase[0]*meshScaling.getX(),graphicsbase[1]*meshScaling.getY(),graphicsbase[2]*meshScaling.getZ());		
				}
				else
				{
					double* graphicsbase = (double*)(vertexbase+graphicsindex*stride);
					
					m_triangle[j] = btVector3(btScalar(graphicsbase[0])*meshScaling.getX(),btScalar(graphicsbase[1])*meshScaling.getY(),btScalar(graphicsbase[2])*meshScaling.getZ());		
				}
			}

			/* Perform ray vs. triangle collision here */
			m_callback->processTriangle(m_triangle,nodeSubPart,nodeTriangleIndex);
			m_meshInterface->unLockReadOnlyVertexBase(nodeSubPart);
		}